

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O3

void pybind11::detail::loader_life_support::add_patient(handle h)

{
  pointer pp_Var1;
  int iVar2;
  internals *piVar3;
  _object *p_Var4;
  cast_error *this;
  
  piVar3 = get_internals();
  pp_Var1 = (piVar3->loader_patient_stack).super__Vector_base<_object_*,_std::allocator<_object_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((piVar3->loader_patient_stack).super__Vector_base<_object_*,_std::allocator<_object_*>_>.
      _M_impl.super__Vector_impl_data._M_start == pp_Var1) {
    this = (cast_error *)__cxa_allocate_exception(0x10);
    cast_error::runtime_error
              (this,
               "When called outside a bound function, py::cast() cannot do Python -> C++ conversions which require the creation of temporary values"
              );
    __cxa_throw(this,&cast_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (pp_Var1[-1] == (_object *)0x0) {
    p_Var4 = (_object *)PyList_New(1);
    pp_Var1[-1] = p_Var4;
    if (p_Var4 == (_object *)0x0) {
      pybind11_fail("loader_life_support: error allocating list");
    }
    if (h.m_ptr != (PyObject *)0x0) {
      (h.m_ptr)->ob_refcnt = (h.m_ptr)->ob_refcnt + 1;
    }
    if ((p_Var4->ob_type->tp_flags & 0x2000000) == 0) {
      __assert_fail("PyList_Check(list_ptr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/pybind11/include/pybind11/detail/type_caster_base.h"
                    ,0x45,"static void pybind11::detail::loader_life_support::add_patient(handle)");
    }
    ((p_Var4[1].ob_type)->ob_base).ob_base.ob_refcnt = (Py_ssize_t)h.m_ptr;
  }
  else {
    iVar2 = PyList_Append(pp_Var1[-1],h.m_ptr);
    if (iVar2 == -1) {
      pybind11_fail("loader_life_support: error adding patient");
    }
  }
  return;
}

Assistant:

PYBIND11_NOINLINE static void add_patient(handle h) {
        auto &stack = get_internals().loader_patient_stack;
        if (stack.empty())
            throw cast_error("When called outside a bound function, py::cast() cannot "
                             "do Python -> C++ conversions which require the creation "
                             "of temporary values");

        auto &list_ptr = stack.back();
        if (list_ptr == nullptr) {
            list_ptr = PyList_New(1);
            if (!list_ptr)
                pybind11_fail("loader_life_support: error allocating list");
            PyList_SET_ITEM(list_ptr, 0, h.inc_ref().ptr());
        } else {
            auto result = PyList_Append(list_ptr, h.ptr());
            if (result == -1)
                pybind11_fail("loader_life_support: error adding patient");
        }
    }